

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  ImGuiLastItemData *pIVar1;
  float *pfVar2;
  ImRect *pIVar3;
  int iVar4;
  ImGuiWindowStackData *pIVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ImVec2 IVar10;
  ImGuiID IVar11;
  ImGuiItemFlags IVar12;
  ImGuiContext *pIVar13;
  ImGuiItemStatusFlags IVar14;
  float fVar15;
  uint uVar16;
  ImGuiWindow *pIVar17;
  
  pIVar13 = GImGui;
  pIVar17 = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     (GImGui->WithinFrameScopeWithImplicitWindow != false)) {
    return;
  }
  if ((pIVar17->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
  }
  PopClipRect();
  PopFocusScope();
  if ((pIVar17->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  if ((pIVar17->DC).IsSetPos == true) {
    ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
  }
  pIVar5 = (pIVar13->CurrentWindowStack).Data;
  iVar4 = (pIVar13->CurrentWindowStack).Size;
  pIVar1 = &pIVar5[(long)iVar4 + -1].ParentLastItemDataBackup;
  IVar11 = pIVar1->ID;
  IVar12 = pIVar1->InFlags;
  IVar14 = pIVar1->StatusFlags;
  fVar15 = (pIVar1->Rect).Min.x;
  pfVar2 = &pIVar5[(long)iVar4 + -1].ParentLastItemDataBackup.Rect.Min.y;
  uVar6 = *(undefined8 *)pfVar2;
  uVar7 = *(undefined8 *)(pfVar2 + 2);
  pfVar2 = &pIVar5[(long)iVar4 + -1].ParentLastItemDataBackup.NavRect.Min.y;
  uVar8 = *(undefined8 *)pfVar2;
  uVar9 = *(undefined8 *)(pfVar2 + 2);
  pIVar3 = &pIVar5[(long)iVar4 + -1].ParentLastItemDataBackup.DisplayRect;
  IVar10 = pIVar3->Max;
  (pIVar13->LastItemData).DisplayRect.Min = pIVar3->Min;
  (pIVar13->LastItemData).DisplayRect.Max = IVar10;
  *(undefined8 *)&(pIVar13->LastItemData).NavRect.Min.y = uVar8;
  *(undefined8 *)&(pIVar13->LastItemData).NavRect.Max.y = uVar9;
  *(undefined8 *)&(pIVar13->LastItemData).Rect.Min.y = uVar6;
  *(undefined8 *)&(pIVar13->LastItemData).Rect.Max.y = uVar7;
  (pIVar13->LastItemData).ID = IVar11;
  (pIVar13->LastItemData).InFlags = IVar12;
  (pIVar13->LastItemData).StatusFlags = IVar14;
  (pIVar13->LastItemData).Rect.Min.x = fVar15;
  uVar16 = pIVar17->Flags;
  if ((uVar16 >> 0x1c & 1) != 0) {
    pIVar13->BeginMenuCount = pIVar13->BeginMenuCount + -1;
    uVar16 = pIVar17->Flags;
  }
  if ((uVar16 >> 0x1a & 1) != 0) {
    (pIVar13->BeginPopupStack).Size = (pIVar13->BeginPopupStack).Size + -1;
  }
  (pIVar13->CurrentWindowStack).Size = iVar4 + -1;
  if (iVar4 + -1 == 0) {
    pIVar17 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar17 = pIVar5[(long)iVar4 + -2].Window;
  }
  SetCurrentWindow(pIVar17);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle
    PopFocusScope();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        g.BeginMenuCount--;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
}